

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse41_128_32.c
# Opt level: O2

parasail_result_t *
parasail_sw_table_diag_sse41_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  parasail_result_t *ppVar6;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  long lVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  char *__format;
  int iVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  int iVar26;
  int iVar27;
  int iVar28;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint uVar31;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar46;
  int iVar48;
  int iVar49;
  int iVar50;
  undefined1 auVar47 [16];
  undefined1 in_XMM15 [16];
  int32_t *local_178;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  uint local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  undefined1 local_128 [16];
  long local_100;
  long local_f8;
  undefined1 local_e8 [16];
  size_t local_d8;
  int iStack_d0;
  int iStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  long local_a0;
  long local_98;
  ulong local_90;
  long local_88;
  long local_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  undefined1 local_58 [16];
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar8 = "_s2";
  }
  else {
    uVar21 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar8 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar8 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar8 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar8 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        uVar10 = (ulong)(uint)matrix->length;
LAB_0065ea7b:
        iVar13 = matrix->min;
        uVar12 = 0x80000000 - iVar13;
        if (iVar13 != -open && SBORROW4(iVar13,-open) == iVar13 + open < 0) {
          uVar12 = open | 0x80000000;
        }
        iVar13 = uVar12 + 1;
        uVar12 = 0x7ffffffe - matrix->max;
        local_b8._4_4_ = iVar13;
        local_b8._0_4_ = iVar13;
        local_b8._8_4_ = iVar13;
        local_b8._12_4_ = iVar13;
        local_e8._4_4_ = iVar13;
        local_e8._0_4_ = iVar13;
        local_e8._8_4_ = iVar13;
        local_e8._12_4_ = iVar13;
        iVar16 = (int)uVar10;
        ppVar6 = parasail_result_new_table1(iVar16,s2Len);
        if (ppVar6 != (parasail_result_t *)0x0) {
          ppVar6->flag = ppVar6->flag | 0x4421004;
          uVar19 = (ulong)(s2Len + 6);
          ptr = parasail_memalign_int32_t(0x10,uVar19);
          ptr_00 = parasail_memalign_int32_t(0x10,uVar19);
          ptr_01 = parasail_memalign_int32_t(0x10,uVar19);
          if (ptr_01 != (int32_t *)0x0 && (ptr_00 != (int32_t *)0x0 && ptr != (int32_t *)0x0)) {
            lVar20 = (long)iVar16;
            if (matrix->type == 0) {
              local_d8 = (size_t)(iVar16 + 3);
              local_178 = parasail_memalign_int32_t(0x10,local_d8);
              uVar19 = 0;
              if (local_178 == (int32_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              uVar15 = 0;
              if (0 < iVar16) {
                uVar15 = uVar10;
              }
              for (; lVar7 = lVar20, uVar15 != uVar19; uVar19 = uVar19 + 1) {
                local_178[uVar19] = matrix->mapper[(byte)_s1[uVar19]];
              }
              for (; lVar7 < (long)local_d8; lVar7 = lVar7 + 1) {
                local_178[lVar7] = 0;
              }
            }
            else {
              local_178 = (int32_t *)0x0;
            }
            uVar17 = s2Len + 3;
            local_78 = uVar12;
            uStack_74 = uVar12;
            uStack_70 = uVar12;
            uStack_6c = uVar12;
            local_58._4_4_ = iVar13;
            local_58._0_4_ = iVar13;
            local_58._8_4_ = iVar13;
            local_58._12_4_ = iVar13;
            local_58 = local_58 >> 0x20;
            local_d8 = CONCAT44(open,open);
            iStack_d0 = open;
            iStack_cc = open;
            local_68 = iVar16;
            iStack_64 = iVar16;
            iStack_60 = iVar16;
            iStack_5c = iVar16;
            local_48 = s2Len;
            iStack_44 = s2Len;
            iStack_40 = s2Len;
            iStack_3c = s2Len;
            piVar2 = matrix->mapper;
            for (uVar10 = 0; uVar21 != uVar10; uVar10 = uVar10 + 1) {
              ptr[uVar10 + 3] = piVar2[(byte)_s2[uVar10]];
            }
            for (lVar7 = 0; uVar10 = uVar21, lVar7 != 3; lVar7 = lVar7 + 1) {
              ptr[lVar7] = 0;
            }
            for (; (int)uVar10 < (int)uVar17; uVar10 = uVar10 + 1) {
              ptr[uVar10 + 3] = 0;
            }
            for (uVar10 = 0; uVar21 != uVar10; uVar10 = uVar10 + 1) {
              ptr_00[uVar10 + 3] = 0;
              ptr_01[uVar10 + 3] = iVar13;
            }
            for (lVar7 = 0; uVar10 = uVar21, lVar7 != 3; lVar7 = lVar7 + 1) {
              ptr_00[lVar7] = iVar13;
              ptr_01[lVar7] = iVar13;
            }
            for (; (int)uVar10 < (int)uVar17; uVar10 = uVar10 + 1) {
              ptr_00[uVar10 + 3] = iVar13;
              ptr_01[uVar10 + 3] = iVar13;
            }
            uVar4 = iVar16 - 1;
            local_f8 = 0;
            uVar10 = (ulong)uVar17;
            if ((int)uVar17 < 1) {
              uVar10 = 0;
            }
            local_100 = uVar21 * 0xc + -0xc;
            local_98 = uVar21 * 0x10;
            local_a0 = uVar21 * 4;
            local_168 = 3;
            iStack_164 = 2;
            iStack_160 = 1;
            iStack_15c = 0;
            local_c8._4_4_ = iVar13;
            local_c8._0_4_ = iVar13;
            local_c8._8_4_ = iVar13;
            local_c8._12_4_ = iVar13;
            auVar45 = local_c8;
            auVar25 = local_c8;
            local_128 = local_c8;
            local_138 = uVar12;
            uStack_134 = uVar12;
            uStack_130 = uVar12;
            uStack_12c = uVar12;
            for (uVar19 = 0; (long)uVar19 < lVar20; uVar19 = uVar19 + 4) {
              uVar15 = uVar19 | 3;
              local_90 = uVar19;
              if (matrix->type == 0) {
                uVar17 = local_178[uVar19];
                uVar18 = local_178[uVar19 + 1];
                uVar9 = local_178[uVar19 + 2];
                uVar14 = local_178[uVar15];
              }
              else {
                uVar17 = (uint)uVar19;
                uVar18 = uVar4;
                if ((long)(uVar19 | 1) < lVar20) {
                  uVar18 = uVar17 | 1;
                }
                uVar9 = uVar17 | 2;
                if (lVar20 <= (long)(uVar19 | 2)) {
                  uVar9 = uVar4;
                }
                uVar14 = uVar17 | 3;
                if (lVar20 <= (long)uVar15) {
                  uVar14 = uVar4;
                }
              }
              piVar2 = matrix->matrix;
              iVar5 = matrix->size;
              local_88 = local_a0 * (uVar19 | 2) + -8;
              local_80 = local_a0 * (uVar19 | 1) + -4;
              auVar40._0_4_ = -(uint)(local_168 < iVar16);
              auVar40._4_4_ = -(uint)(iStack_164 < iVar16);
              auVar40._8_4_ = -(uint)(iStack_160 < iVar16);
              auVar40._12_4_ = -(uint)(iStack_15c < iVar16);
              uVar11 = 0;
              auVar38._4_4_ = iVar13;
              auVar38._0_4_ = iVar13;
              auVar38._8_4_ = iVar13;
              auVar38._12_4_ = iVar13;
              in_XMM15 = pmovsxbd(in_XMM15,0xfffefd);
              auVar29 = local_58;
              auVar30 = local_58;
              auVar47 = auVar38;
              for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
                iVar1 = ptr_00[uVar11 + 3];
                iVar22 = auVar30._4_4_ - open;
                iVar26 = auVar30._8_4_ - open;
                iVar27 = auVar30._12_4_ - open;
                iVar28 = iVar1 - open;
                iVar46 = auVar47._4_4_ - gap;
                iVar48 = auVar47._8_4_ - gap;
                iVar49 = auVar47._12_4_ - gap;
                iVar50 = ptr_01[uVar11 + 3] - gap;
                auVar47._0_4_ = (uint)(iVar46 < iVar22) * iVar22 | (uint)(iVar46 >= iVar22) * iVar46
                ;
                auVar47._4_4_ = (uint)(iVar48 < iVar26) * iVar26 | (uint)(iVar48 >= iVar26) * iVar48
                ;
                auVar47._8_4_ = (uint)(iVar49 < iVar27) * iVar27 | (uint)(iVar49 >= iVar27) * iVar49
                ;
                auVar47._12_4_ =
                     (uint)(iVar50 < iVar28) * iVar28 | (uint)(iVar50 >= iVar28) * iVar50;
                iVar46 = auVar30._0_4_ - open;
                iVar48 = auVar30._4_4_ - open;
                iVar49 = auVar30._8_4_ - open;
                iVar50 = auVar30._12_4_ - open;
                iVar22 = auVar38._0_4_ - gap;
                iVar26 = auVar38._4_4_ - gap;
                iVar27 = auVar38._8_4_ - gap;
                iVar28 = auVar38._12_4_ - gap;
                auVar37._0_4_ = (uint)(iVar22 < iVar46) * iVar46 | (uint)(iVar22 >= iVar46) * iVar22
                ;
                auVar37._4_4_ = (uint)(iVar26 < iVar48) * iVar48 | (uint)(iVar26 >= iVar48) * iVar26
                ;
                auVar37._8_4_ = (uint)(iVar27 < iVar49) * iVar49 | (uint)(iVar27 >= iVar49) * iVar27
                ;
                auVar37._12_4_ =
                     (uint)(iVar28 < iVar50) * iVar50 | (uint)(iVar28 >= iVar50) * iVar28;
                iVar46 = piVar2[(long)(int)(uVar14 * iVar5) + (long)ptr[uVar11]] + auVar29._0_4_;
                iVar48 = piVar2[(long)(int)(uVar9 * iVar5) + (long)ptr[uVar11 + 1]] + auVar29._4_4_;
                iVar49 = piVar2[(long)(int)(uVar18 * iVar5) + (long)ptr[uVar11 + 2]] + auVar29._8_4_
                ;
                iVar50 = piVar2[(long)(int)(uVar17 * iVar5) + (long)ptr[uVar11 + 3]] +
                         auVar29._12_4_;
                uVar31 = ((int)auVar37._0_4_ < (int)auVar47._0_4_) * auVar47._0_4_ |
                         ((int)auVar37._0_4_ >= (int)auVar47._0_4_) * auVar37._0_4_;
                uVar34 = ((int)auVar37._4_4_ < (int)auVar47._4_4_) * auVar47._4_4_ |
                         ((int)auVar37._4_4_ >= (int)auVar47._4_4_) * auVar37._4_4_;
                uVar35 = ((int)auVar37._8_4_ < (int)auVar47._8_4_) * auVar47._8_4_ |
                         ((int)auVar37._8_4_ >= (int)auVar47._8_4_) * auVar37._8_4_;
                uVar36 = ((int)auVar37._12_4_ < (int)auVar47._12_4_) * auVar47._12_4_ |
                         ((int)auVar37._12_4_ >= (int)auVar47._12_4_) * auVar37._12_4_;
                iVar26 = (-1 < (int)uVar31) * uVar31;
                iVar22 = (-1 < (int)uVar34) * uVar34;
                iVar27 = (-1 < (int)uVar35) * uVar35;
                iVar28 = (-1 < (int)uVar36) * uVar36;
                auVar32._0_4_ = (uint)(iVar26 < iVar46) * iVar46 | (uint)(iVar26 >= iVar46) * iVar26
                ;
                auVar32._4_4_ = (uint)(iVar22 < iVar48) * iVar48 | (uint)(iVar22 >= iVar48) * iVar22
                ;
                auVar32._8_4_ = (uint)(iVar27 < iVar49) * iVar49 | (uint)(iVar27 >= iVar49) * iVar27
                ;
                auVar32._12_4_ =
                     (uint)(iVar28 < iVar50) * iVar50 | (uint)(iVar28 >= iVar50) * iVar28;
                iVar46 = in_XMM15._0_4_;
                auVar23._0_4_ = -(uint)(iVar46 == -1);
                iVar48 = in_XMM15._4_4_;
                auVar23._4_4_ = -(uint)(iVar48 == -1);
                iVar49 = in_XMM15._8_4_;
                iVar50 = in_XMM15._12_4_;
                auVar23._8_4_ = -(uint)(iVar49 == -1);
                auVar23._12_4_ = -(uint)(iVar50 == -1);
                auVar39 = ~auVar23 & auVar32;
                auVar42._4_4_ = iVar13;
                auVar42._0_4_ = iVar13;
                auVar42._8_4_ = iVar13;
                auVar42._12_4_ = iVar13;
                auVar47 = blendvps(auVar47,auVar42,auVar23);
                auVar38 = blendvps(auVar37,auVar42,auVar23);
                iVar28 = auVar39._0_4_;
                iVar22 = auVar39._4_4_;
                iVar27 = auVar39._12_4_;
                iVar26 = auVar39._8_4_;
                if (3 < uVar11) {
                  local_138 = (uint)(iVar28 < (int)local_138) * iVar28 |
                              (iVar28 >= (int)local_138) * local_138;
                  uStack_134 = (uint)(iVar22 < (int)uStack_134) * iVar22 |
                               (iVar22 >= (int)uStack_134) * uStack_134;
                  uStack_130 = (uint)(iVar26 < (int)uStack_130) * iVar26 |
                               (iVar26 >= (int)uStack_130) * uStack_130;
                  uStack_12c = (uint)(iVar27 < (int)uStack_12c) * iVar27 |
                               (iVar27 >= (int)uStack_12c) * uStack_12c;
                  local_128._4_4_ =
                       (uint)((int)local_128._4_4_ < iVar22) * iVar22 |
                       (uint)((int)local_128._4_4_ >= iVar22) * local_128._4_4_;
                  local_128._0_4_ =
                       (uint)((int)local_128._0_4_ < iVar28) * iVar28 |
                       (uint)((int)local_128._0_4_ >= iVar28) * local_128._0_4_;
                  local_128._8_4_ =
                       (uint)((int)local_128._8_4_ < iVar26) * iVar26 |
                       (uint)((int)local_128._8_4_ >= iVar26) * local_128._8_4_;
                  local_128._12_4_ =
                       (uint)((int)local_128._12_4_ < iVar27) * iVar27 |
                       (uint)((int)local_128._12_4_ >= iVar27) * local_128._12_4_;
                }
                piVar3 = ((ppVar6->field_4).rowcols)->score_row;
                if (uVar11 < uVar21) {
                  *(int *)((long)piVar3 + uVar11 * 4 + local_f8) = iVar27;
                }
                if (uVar11 - 1 < uVar21 && (long)(uVar19 | 1) < lVar20) {
                  *(int *)((long)piVar3 + uVar11 * 4 + local_80) = iVar26;
                }
                if (((long)(uVar19 | 2) < lVar20) &&
                   ((long)(uVar11 - 2) < (long)uVar21 && 1 < uVar11)) {
                  *(int *)((long)piVar3 + uVar11 * 4 + local_88) = iVar22;
                }
                if (2 < uVar11 && (long)uVar15 < lVar20) {
                  *(int *)((long)piVar3 + uVar11 * 4 + local_100) = iVar28;
                }
                auVar24._0_4_ = -(uint)(iVar46 < s2Len);
                auVar24._4_4_ = -(uint)(iVar48 < s2Len);
                auVar24._8_4_ = -(uint)(iVar49 < s2Len);
                auVar24._12_4_ = -(uint)(iVar50 < s2Len);
                auVar41._0_4_ = iVar46 >> 0x1f;
                auVar41._4_4_ = iVar48 >> 0x1f;
                auVar41._8_4_ = iVar49 >> 0x1f;
                auVar41._12_4_ = iVar50 >> 0x1f;
                auVar42 = ~auVar41 & auVar24 & auVar40;
                auVar43._0_4_ = -(uint)(iVar28 == auVar45._0_4_);
                auVar43._4_4_ = -(uint)(iVar22 == auVar45._4_4_);
                auVar43._8_4_ = -(uint)(iVar26 == auVar45._8_4_);
                auVar43._12_4_ = -(uint)(iVar27 == auVar45._12_4_);
                auVar44._0_4_ = -(uint)(auVar45._0_4_ < iVar28);
                auVar44._4_4_ = -(uint)(auVar45._4_4_ < iVar22);
                auVar44._8_4_ = -(uint)(auVar45._8_4_ < iVar26);
                auVar44._12_4_ = -(uint)(auVar45._12_4_ < iVar27);
                local_b8 = blendvps(auVar45,auVar32,auVar44 & auVar42);
                auVar33._0_4_ = -(uint)(iVar46 < auVar25._0_4_);
                auVar33._4_4_ = -(uint)(iVar48 < auVar25._4_4_);
                auVar33._8_4_ = -(uint)(iVar49 < auVar25._8_4_);
                auVar33._12_4_ = -(uint)(iVar50 < auVar25._12_4_);
                auVar29 = blendvps(auVar44 & auVar42,auVar42,auVar33 & auVar43);
                auVar45._4_4_ = iStack_164;
                auVar45._0_4_ = local_168;
                auVar45._8_4_ = iStack_160;
                auVar45._12_4_ = iStack_15c;
                local_c8 = blendvps(local_c8,auVar45,auVar29);
                ptr_00[uVar11] = iVar28;
                ptr_01[uVar11] = auVar47._0_4_;
                local_e8 = blendvps(auVar25,in_XMM15,(auVar33 & auVar43 | auVar44) & auVar42);
                in_XMM15._0_4_ = iVar46 + 1;
                in_XMM15._4_4_ = iVar48 + 1;
                in_XMM15._8_4_ = iVar49 + 1;
                in_XMM15._12_4_ = iVar50 + 1;
                auVar29._12_4_ = iVar1;
                auVar29._0_12_ = auVar30._4_12_;
                auVar30 = auVar39;
                auVar45 = local_b8;
                auVar25 = local_e8;
              }
              local_168 = local_168 + 4;
              iStack_164 = iStack_164 + 4;
              iStack_160 = iStack_160 + 4;
              iStack_15c = iStack_15c + 4;
              local_100 = local_100 + local_98;
              local_f8 = local_f8 + local_98;
            }
            iVar22 = 0;
            iVar5 = 0;
            iVar16 = iVar13;
            for (lVar20 = 0; (int)lVar20 != 4; lVar20 = lVar20 + 1) {
              iVar26 = *(int *)(local_b8 + lVar20 * 4);
              if (iVar16 < iVar26) {
                iVar16 = iVar26;
                iVar5 = *(int *)(local_c8 + lVar20 * 4);
                iVar22 = *(int *)(local_e8 + lVar20 * 4);
              }
              else if (iVar26 == iVar16) {
                iVar26 = *(int *)(local_e8 + lVar20 * 4);
                if (iVar26 < iVar22) {
                  iVar5 = *(int *)(local_c8 + lVar20 * 4);
                  iVar22 = iVar26;
                }
                else if ((iVar26 == iVar22) && (*(int *)(local_c8 + lVar20 * 4) < iVar5)) {
                  iVar5 = *(int *)(local_c8 + lVar20 * 4);
                }
              }
            }
            auVar25._0_4_ = -(uint)((int)local_138 < iVar13);
            auVar25._4_4_ = -(uint)((int)uStack_134 < iVar13);
            auVar25._8_4_ = -(uint)((int)uStack_130 < iVar13);
            auVar25._12_4_ = -(uint)((int)uStack_12c < iVar13);
            auVar30._0_4_ = -(uint)((int)uVar12 < (int)local_128._0_4_);
            auVar30._4_4_ = -(uint)((int)uVar12 < (int)local_128._4_4_);
            auVar30._8_4_ = -(uint)((int)uVar12 < (int)local_128._8_4_);
            auVar30._12_4_ = -(uint)((int)uVar12 < (int)local_128._12_4_);
            iVar13 = movmskps(4,auVar30 | auVar25);
            if (iVar13 != 0) {
              *(byte *)&ppVar6->flag = (byte)ppVar6->flag | 0x40;
              iVar16 = 0;
              iVar22 = 0;
              iVar5 = 0;
            }
            ppVar6->score = iVar16;
            ppVar6->end_query = iVar5;
            ppVar6->end_ref = iVar22;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(local_178);
              return ppVar6;
            }
            return ppVar6;
          }
        }
        return (parasail_result_t *)0x0;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar8 = "_s1";
      }
      else {
        uVar10 = (ulong)(uint)_s1Len;
        if (0 < _s1Len) goto LAB_0065ea7b;
        __format = "%s: %s must be > 0\n";
        pcVar8 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_table_diag_sse41_128_32",pcVar8);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 4); /* shift in a 0 */
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vZero = _mm_set1_epi32(0);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vJLimit = _mm_set1_epi32(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m128i vIltLimit = _mm_cmplt_epi32(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, F_pr[j], 3);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32(vNWH, vE);
            vWH = _mm_max_epi32(vWH, vF);
            vWH = _mm_max_epi32(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi32(vJ, vNegOne),
                        _mm_cmplt_epi32(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi32(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi32(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi32(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
    }

    /* alignment ending position */
    {
        int32_t *t = (int32_t*)&vMaxH;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}